

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O0

void __thiscall XPMP2::SoundSystemFMOD::Update(SoundSystemFMOD *this)

{
  long in_RDI;
  float fVar1;
  FMOD_VECTOR normUpw;
  FMOD_VECTOR normForw;
  FMOD_VECTOR velocity;
  FMOD_VECTOR posCam;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  int iVar2;
  FmodError *in_stack_fffffffffffffd00;
  allocator<char> *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  FMOD_VECTOR *in_stack_fffffffffffffd18;
  FMOD_VECTOR *in_stack_fffffffffffffd20;
  float in_stack_fffffffffffffd30;
  float in_stack_fffffffffffffd34;
  string *in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd44;
  string *in_stack_fffffffffffffd48;
  FMOD_RESULT in_stack_fffffffffffffd54;
  string *in_stack_fffffffffffffd58;
  FmodError *in_stack_fffffffffffffd60;
  allocator<char> local_279;
  string local_278 [8];
  allocator<char> in_stack_fffffffffffffe0f;
  SoundSystemFMOD *in_stack_fffffffffffffe10;
  allocator<char> local_1c9;
  string local_1c8 [39];
  undefined1 local_1a1 [136];
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [55];
  allocator<char> local_b9;
  string local_b8 [128];
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_14 = DAT_0047ddd8;
  local_10 = DAT_0047dddc;
  local_c = DAT_0047dde0;
  local_20 = DAT_0047de10;
  local_1c = DAT_0047de14;
  local_18 = DAT_0047de18;
  FmodNormalizeHeadingPitch(&DAT_0047dde8,&DAT_0047dde4);
  FmodHeadPitchRoll2Normal
            (in_stack_fffffffffffffd34,in_stack_fffffffffffffd30,(float)((ulong)in_RDI >> 0x20),
             in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  gFmodRes = FMOD_System_Set3DListenerAttributes
                       (*(undefined8 *)(in_RDI + 0x80),0,&local_14,&local_20,&local_2c,&local_38);
  if (gFmodRes != 0) {
    if (gFmodRes == 0x24) {
      in_stack_fffffffffffffd00 = (FmodError *)local_1a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (char *)in_stack_fffffffffffffd08,(allocator<char> *)in_stack_fffffffffffffd00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (char *)in_stack_fffffffffffffd08,(allocator<char> *)in_stack_fffffffffffffd00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (char *)in_stack_fffffffffffffd08,(allocator<char> *)in_stack_fffffffffffffd00);
      FmodError::FmodError
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,
                 in_stack_fffffffffffffd48,in_stack_fffffffffffffd44,in_stack_fffffffffffffd38);
      FmodError::LogErr(in_stack_fffffffffffffd00);
      FmodError::~FmodError
                ((FmodError *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe0f);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      std::__cxx11::string::~string((string *)(local_1a1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1a1);
      fVar1 = GetMiscNetwTime();
      if (Update::lastInvVecErrMsgTS + 300.0 <= fVar1) {
        Update::lastInvVecErrMsgTS = GetMiscNetwTime();
        if (glob < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,0x1b5,"Update",logERR,
                 "Please report the following details as a reply to https://bit.ly/LTSound36");
        }
        if (glob < 4) {
          LogMsg((char *)(double)DAT_0047ddec,(int)(double)DAT_0047dde4,(char *)(double)DAT_0047dde8
                 ,0x3cf599,(char *)0x1b7,"Update",3,"Camera   roll=%.3f, heading=%.3f, pitch=%.3f");
        }
        if (glob < 4) {
          LogMsg((char *)(double)local_2c,(int)(double)local_28,(char *)(double)local_24,0x3cf599,
                 (char *)0x1b8,"Update",3,"normForw x=%.6f, y=%.6f, z=%.6f");
        }
        if (glob < 4) {
          LogMsg((char *)(double)local_38,(int)(double)local_34,(char *)(double)local_30,0x3cf599,
                 (char *)0x1b9,"Update",3,"normUpw  x=%.6f, y=%.6f, z=%.6f");
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (char *)in_stack_fffffffffffffd08,(allocator<char> *)in_stack_fffffffffffffd00);
      in_stack_fffffffffffffd14 = gFmodRes;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (char *)in_stack_fffffffffffffd08,(allocator<char> *)in_stack_fffffffffffffd00);
      in_stack_fffffffffffffd08 = &local_119;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (char *)in_stack_fffffffffffffd08,(allocator<char> *)in_stack_fffffffffffffd00);
      FmodError::FmodError
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,
                 in_stack_fffffffffffffd48,in_stack_fffffffffffffd44,in_stack_fffffffffffffd38);
      FmodError::LogErr(in_stack_fffffffffffffd00);
      FmodError::~FmodError
                ((FmodError *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator(&local_119);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
  }
  IsViewExternal();
  SetLowPassGain(in_stack_fffffffffffffe10,(bool)in_stack_fffffffffffffe0f);
  gFmodRes = FMOD_System_Update(*(undefined8 *)(in_RDI + 0x80));
  if (gFmodRes != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08,(allocator<char> *)in_stack_fffffffffffffd00);
    iVar2 = gFmodRes;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08,(allocator<char> *)in_stack_fffffffffffffd00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08,(allocator<char> *)in_stack_fffffffffffffd00);
    FmodError::FmodError
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,
               in_stack_fffffffffffffd48,in_stack_fffffffffffffd44,in_stack_fffffffffffffd38);
    FmodError::LogErr(in_stack_fffffffffffffd00);
    FmodError::~FmodError((FmodError *)CONCAT44(iVar2,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd37);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd60);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd5f);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator(&local_279);
  }
  return;
}

Assistant:

void SoundSystemFMOD::Update ()
{
    // Update the listener position and orientation
    const FMOD_VECTOR posCam   = {
        glob.posCamera.x,
        glob.posCamera.y,
        glob.posCamera.z
    };
    const FMOD_VECTOR velocity  = { glob.vCam_x, glob.vCam_y, glob.vCam_z };
    
    // The forward direction takes heading, pitch, and roll into account
    FmodNormalizeHeadingPitch(glob.posCamera.heading, glob.posCamera.pitch);
    FMOD_VECTOR normForw;
    FMOD_VECTOR normUpw;
    FmodHeadPitchRoll2Normal(glob.posCamera.heading, glob.posCamera.pitch, glob.posCamera.roll, normForw, normUpw);
    
    // FMOD_ERR_INVALID_VECTOR used to be a problem, but should be no longer
    // Still, just in case it comes back, we log more details
    gFmodRes = FMOD_System_Set3DListenerAttributes(pFmodSystem, 0, &posCam, &velocity, &normForw, &normUpw);
    if (gFmodRes != FMOD_OK) {
        if (gFmodRes != FMOD_ERR_INVALID_VECTOR)
            FmodError("FMOD_System_Set3DListenerAttributes", gFmodRes, __FILE__, __LINE__, __func__).LogErr();
        else
        {
            static float lastInvVecErrMsgTS = -500.0f;
            FmodError("FMOD_System_Set3DListenerAttributes", gFmodRes, __FILE__, __LINE__, __func__).LogErr();
            if (GetMiscNetwTime() >= lastInvVecErrMsgTS + 300.0f) {
                lastInvVecErrMsgTS = GetMiscNetwTime();
                LOG_MSG(logERR, "Please report the following details as a reply to https://bit.ly/LTSound36");
                LOG_MSG(logERR, "Camera   roll=%.3f, heading=%.3f, pitch=%.3f",
                        glob.posCamera.roll, glob.posCamera.pitch, glob.posCamera.heading);
                LOG_MSG(logERR, "normForw x=%.6f, y=%.6f, z=%.6f", normForw.x, normForw.y, normForw.z);
                LOG_MSG(logERR, "normUpw  x=%.6f, y=%.6f, z=%.6f", normUpw.x, normUpw.y, normUpw.z);
            }
        }
    }

    // Set low pass gain in case we're in an internal view
    SetLowPassGain(!IsViewExternal());

    // Tell FMOD we're done
    FMOD_LOG(FMOD_System_Update(pFmodSystem));
}